

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_char,_signed_char>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_char,_signed_char> *this,uchar value,bool is_valid)

{
  byte bVar1;
  bool bVar2;
  idx_t iVar3;
  
  iVar3 = this->compression_buffer_idx;
  this->compression_buffer_validity[iVar3] = is_valid;
  this->all_valid = (bool)(this->all_valid & is_valid);
  this->all_invalid = (bool)(this->all_invalid & !is_valid);
  if (is_valid) {
    this->compression_buffer[iVar3] = value;
    bVar1 = this->minimum;
    if (value <= bVar1) {
      bVar1 = value;
    }
    this->minimum = bVar1;
    if (value < this->maximum) {
      value = this->maximum;
    }
    this->maximum = value;
    iVar3 = this->compression_buffer_idx;
  }
  this->compression_buffer_idx = iVar3 + 1;
  if (iVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::EmptyBitpackingWriter>(this);
    this->minimum = 0xff;
    this->minimum_delta = '\x7f';
    this->maximum = '\0';
    this->min_max_diff = '\0';
    this->maximum_delta = -0x80;
    this->min_max_delta_diff = '\0';
    this->delta_offset = '\0';
    this->all_valid = true;
    this->all_invalid = true;
    this->can_do_delta = false;
    this->can_do_for = false;
    this->compression_buffer_idx = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}